

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * CLI::detail::rtrim(string *str)

{
  string *in_RDI;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  it;
  string *__i;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  __const_iterator in_stack_ffffffffffffffe0;
  __const_iterator in_stack_ffffffffffffffe8;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_10;
  string *local_8;
  
  local_8 = in_RDI;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rbegin
            (in_stack_ffffffffffffffb8);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rend
            (in_stack_ffffffffffffffb8);
  ::std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>
            (&local_10,&stack0xffffffffffffffe8,&stack0xffffffffffffffe0);
  __i = local_8;
  std::
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::base(&local_10);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            (in_stack_ffffffffffffffb0,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)__i);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
            (in_stack_ffffffffffffffb8);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            (in_stack_ffffffffffffffb0,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)__i);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  return local_8;
}

Assistant:

CLI11_INLINE std::string &rtrim(std::string &str) {
    auto it = std::find_if(str.rbegin(), str.rend(), [](char ch) { return !std::isspace<char>(ch, std::locale()); });
    str.erase(it.base(), str.end());
    return str;
}